

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O1

void google::protobuf::util::anon_unknown_0::ConvertOptionField
               (Reflection *reflection,Message *options,FieldDescriptor *field,int index,Option *out
               )

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  int32_t iVar4;
  uint32_t uVar5;
  Any *pAVar6;
  Message *message;
  uint64_t uVar7;
  EnumValueDescriptor *pEVar8;
  int64_t iVar9;
  Nonnull<const_char_*> pcVar10;
  undefined8 extraout_RAX;
  bool bVar11;
  Arena *pAVar12;
  _Alloc_hider _Var13;
  float fVar14;
  string_view value;
  Int32Value wrapper;
  undefined1 local_b0 [24];
  uint32_t local_98;
  undefined4 uStack_94;
  double local_90;
  undefined1 local_88 [32];
  string local_68;
  undefined1 local_48 [32];
  
  pcVar3 = (field->all_names_).payload_;
  value._M_len = (ulong)*(ushort *)(pcVar3 + ((byte)field->field_0x1 >> 2 & 2));
  (out->field_0)._impl_._has_bits_.has_bits_[0] = (out->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = pcVar3 + ~value._M_len;
  pAVar12 = (Arena *)(out->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(out->field_0)._impl_.name_,value,pAVar12);
  *(byte *)&out->field_0 = *(byte *)&out->field_0 | 2;
  if ((out->field_0)._impl_.value_ == (Any *)0x0) {
    pAVar12 = (Arena *)(out->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
    }
    pAVar6 = (Any *)Arena::DefaultConstruct<google::protobuf::Any>(pAVar12);
    (out->field_0)._impl_.value_ = pAVar6;
  }
  if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) - 1U) {
    return;
  }
  pAVar6 = (out->field_0)._impl_.value_;
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        iVar4 = Reflection::GetInt32(reflection,options,field);
      }
      else {
        iVar4 = Reflection::GetRepeatedInt32(reflection,options,field,index);
      }
      Int32Value::Int32Value((Int32Value *)local_b0,(Arena *)0x0);
      local_98 = iVar4;
      local_b0[0x10] = local_b0[0x10] | 1;
      Any::PackFrom(pAVar6,(Message *)local_b0);
LAB_0101e066:
      Int32Value::~Int32Value((Int32Value *)local_b0);
      return;
    }
    goto LAB_0101e3fd;
  case 2:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        iVar9 = Reflection::GetInt64(reflection,options,field);
      }
      else {
        iVar9 = Reflection::GetRepeatedInt64(reflection,options,field,index);
      }
      Int64Value::Int64Value((Int64Value *)local_b0,(Arena *)0x0);
      local_b0[0x10] = local_b0[0x10] | 1;
      _local_98 = iVar9;
      Any::PackFrom(pAVar6,(Message *)local_b0);
      Int64Value::~Int64Value((Int64Value *)local_b0);
      return;
    }
    goto LAB_0101e424;
  case 3:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        uVar5 = Reflection::GetUInt32(reflection,options,field);
      }
      else {
        uVar5 = Reflection::GetRepeatedUInt32(reflection,options,field,index);
      }
      UInt32Value::UInt32Value((UInt32Value *)local_b0,(Arena *)0x0);
      local_98 = uVar5;
      local_b0[0x10] = local_b0[0x10] | 1;
      Any::PackFrom(pAVar6,(Message *)local_b0);
      UInt32Value::~UInt32Value((UInt32Value *)local_b0);
      return;
    }
    goto LAB_0101e3f0;
  case 4:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        uVar7 = Reflection::GetUInt64(reflection,options,field);
      }
      else {
        uVar7 = Reflection::GetRepeatedUInt64(reflection,options,field,index);
      }
      UInt64Value::UInt64Value((UInt64Value *)local_b0,(Arena *)0x0);
      local_b0[0x10] = local_b0[0x10] | 1;
      _local_98 = uVar7;
      Any::PackFrom(pAVar6,(Message *)local_b0);
      UInt64Value::~UInt64Value((UInt64Value *)local_b0);
      return;
    }
    goto LAB_0101e40a;
  case 5:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        local_90 = Reflection::GetDouble(reflection,options,field);
      }
      else {
        local_90 = Reflection::GetRepeatedDouble(reflection,options,field,index);
      }
      DoubleValue::DoubleValue((DoubleValue *)local_b0,(Arena *)0x0);
      _local_98 = local_90;
      local_b0[0x10] = local_b0[0x10] | 1;
      Any::PackFrom(pAVar6,(Message *)local_b0);
      DoubleValue::~DoubleValue((DoubleValue *)local_b0);
      return;
    }
    util::_GLOBAL__N_1::ConvertOptionField();
    break;
  case 6:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        fVar14 = Reflection::GetFloat(reflection,options,field);
      }
      else {
        fVar14 = Reflection::GetRepeatedFloat(reflection,options,field,index);
      }
      local_90 = (double)CONCAT44(local_90._4_4_,fVar14);
      FloatValue::FloatValue((FloatValue *)local_b0,(Arena *)0x0);
      local_98 = local_90._0_4_;
      local_b0[0x10] = local_b0[0x10] | 1;
      Any::PackFrom(pAVar6,(Message *)local_b0);
      FloatValue::~FloatValue((FloatValue *)local_b0);
      return;
    }
    goto LAB_0101e431;
  case 7:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        bVar11 = Reflection::GetBool(reflection,options,field);
      }
      else {
        bVar11 = Reflection::GetRepeatedBool(reflection,options,field,index);
      }
      BoolValue::BoolValue((BoolValue *)local_b0,(Arena *)0x0);
      local_98._0_1_ = bVar11;
      local_b0[0x10] = local_b0[0x10] | 1;
      Any::PackFrom(pAVar6,(Message *)local_b0);
      BoolValue::~BoolValue((BoolValue *)local_b0);
      return;
    }
    goto LAB_0101e43e;
  case 8:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        pEVar8 = Reflection::GetEnum(reflection,options,field);
      }
      else {
        pEVar8 = Reflection::GetRepeatedEnum(reflection,options,field,index);
      }
      iVar2 = pEVar8->number_;
      Int32Value::Int32Value((Int32Value *)local_b0,(Arena *)0x0);
      local_98 = iVar2;
      local_b0[0x10] = local_b0[0x10] | 1;
      Any::PackFrom(pAVar6,(Message *)local_b0);
      goto LAB_0101e066;
    }
    goto LAB_0101e417;
  case 9:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        Reflection::GetString_abi_cxx11_((string *)local_b0,reflection,options,field);
      }
      else {
        Reflection::GetRepeatedString_abi_cxx11_((string *)local_b0,reflection,options,field,index);
      }
      if (field->type_ == '\t') {
        local_48._0_8_ = (FieldDescriptor *)(local_48 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,local_b0._0_8_,(pointer)(local_b0._0_8_ + local_b0._8_8_));
        StringValue::StringValue((StringValue *)local_88,(Arena *)0x0);
        local_88[0x10] = local_88[0x10] | 1;
        if ((local_88._8_8_ & 1) != 0) {
          local_88._8_8_ = *(undefined8 *)(local_88._8_8_ & 0xfffffffffffffffe);
        }
        protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(local_88 + 0x18),(string *)local_48,(Arena *)local_88._8_8_);
        Any::PackFrom(pAVar6,(Message *)local_88);
        StringValue::~StringValue((StringValue *)local_88);
        local_68.field_2._M_allocated_capacity = local_48._16_8_;
        _Var13._M_p = (pointer)local_48._0_8_;
        if ((FieldDescriptor *)local_48._0_8_ == (FieldDescriptor *)(local_48 + 0x10))
        goto LAB_0101e263;
      }
      else {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_b0._0_8_,(pointer)(local_b0._0_8_ + local_b0._8_8_));
        BytesValue::BytesValue((BytesValue *)local_88,(Arena *)0x0);
        local_88[0x10] = local_88[0x10] | 1;
        if ((local_88._8_8_ & 1) != 0) {
          local_88._8_8_ = *(undefined8 *)(local_88._8_8_ & 0xfffffffffffffffe);
        }
        protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(local_88 + 0x18),&local_68,(Arena *)local_88._8_8_);
        Any::PackFrom(pAVar6,(Message *)local_88);
        BytesValue::~BytesValue((BytesValue *)local_88);
        _Var13._M_p = local_68._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0101e263;
      }
      operator_delete(_Var13._M_p,local_68.field_2._M_allocated_capacity + 1);
LAB_0101e263:
      if ((undefined1 *)local_b0._0_8_ == local_b0 + 0x10) {
        return;
      }
      operator_delete((void *)local_b0._0_8_,CONCAT71(local_b0._17_7_,local_b0[0x10]) + 1);
      return;
    }
    goto LAB_0101e44b;
  case 10:
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        message = Reflection::GetMessage(reflection,options,field,(MessageFactory *)0x0);
      }
      else {
        message = Reflection::GetRepeatedMessage(reflection,options,field,index);
      }
      Any::PackFrom(pAVar6,message);
      return;
    }
  }
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_0101e3f0:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_0101e3fd:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_0101e40a:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_0101e417:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_0101e424:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_0101e431:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_0101e43e:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_0101e44b:
  util::_GLOBAL__N_1::ConvertOptionField();
  BytesValue::~BytesValue((BytesValue *)local_88);
  if ((FieldDescriptor *)local_68._M_dataplus._M_p != field) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,CONCAT71(local_b0._17_7_,local_b0[0x10]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ConvertOptionField(const Reflection* reflection, const Message& options,
                        const FieldDescriptor* field, int index, Option* out) {
  out->set_name(field->is_extension() ? field->full_name() : field->name());
  Any* value = out->mutable_value();
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_MESSAGE:
      value->PackFrom(
          field->is_repeated()
              ? reflection->GetRepeatedMessage(options, field, index)
              : reflection->GetMessage(options, field));
      return;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      value->PackFrom(WrapValue<DoubleValue>(
          field->is_repeated()
              ? reflection->GetRepeatedDouble(options, field, index)
              : reflection->GetDouble(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      value->PackFrom(WrapValue<FloatValue>(
          field->is_repeated()
              ? reflection->GetRepeatedFloat(options, field, index)
              : reflection->GetFloat(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      value->PackFrom(WrapValue<Int64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt64(options, field, index)
              : reflection->GetInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      value->PackFrom(WrapValue<UInt64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt64(options, field, index)
              : reflection->GetUInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      value->PackFrom(WrapValue<Int32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt32(options, field, index)
              : reflection->GetInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      value->PackFrom(WrapValue<UInt32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt32(options, field, index)
              : reflection->GetUInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      value->PackFrom(WrapValue<BoolValue>(
          field->is_repeated()
              ? reflection->GetRepeatedBool(options, field, index)
              : reflection->GetBool(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_STRING: {
      const std::string& val =
          field->is_repeated()
              ? reflection->GetRepeatedString(options, field, index)
              : reflection->GetString(options, field);
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        value->PackFrom(WrapValue<StringValue>(val));
      } else {
        value->PackFrom(WrapValue<BytesValue>(val));
      }
      return;
    }
    case FieldDescriptor::CPPTYPE_ENUM: {
      const EnumValueDescriptor* val =
          field->is_repeated()
              ? reflection->GetRepeatedEnum(options, field, index)
              : reflection->GetEnum(options, field);
      value->PackFrom(WrapValue<Int32Value>(val->number()));
      return;
    }
  }
}